

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

MockSpec<TestResult_(mp::LogicalCountExpr)> * __thiscall
testing::internal::FunctionMocker<TestResult_(mp::LogicalCountExpr)>::With
          (FunctionMocker<TestResult_(mp::LogicalCountExpr)> *this,Matcher<mp::LogicalCountExpr> *m1
          )

{
  MockSpec<TestResult_(mp::LogicalCountExpr)> *pMVar1;
  FunctionMockerBase<TestResult_(mp::LogicalCountExpr)> *in_RDI;
  Matcher<mp::LogicalCountExpr> *in_stack_ffffffffffffffa8;
  
  FunctionMockerBase<TestResult_(mp::LogicalCountExpr)>::current_spec(in_RDI);
  std::make_tuple<testing::Matcher<mp::LogicalCountExpr>const&>(in_stack_ffffffffffffffa8);
  MockSpec<TestResult_(mp::LogicalCountExpr)>::SetMatchers
            ((MockSpec<TestResult_(mp::LogicalCountExpr)> *)in_RDI,
             (ArgumentMatcherTuple *)in_stack_ffffffffffffffa8);
  std::tuple<testing::Matcher<mp::LogicalCountExpr>_>::~tuple
            ((tuple<testing::Matcher<mp::LogicalCountExpr>_> *)0x19c4c1);
  pMVar1 = FunctionMockerBase<TestResult_(mp::LogicalCountExpr)>::current_spec(in_RDI);
  return pMVar1;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }